

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O2

void us_internal_loop_link(us_loop_t *loop,us_socket_context_t *context)

{
  us_socket_context_t *puVar1;
  
  puVar1 = (loop->data).head;
  context->next = puVar1;
  context->prev = (us_socket_context_t *)0x0;
  if (puVar1 != (us_socket_context_t *)0x0) {
    puVar1->prev = context;
  }
  (loop->data).head = context;
  return;
}

Assistant:

void us_internal_loop_link(struct us_loop_t *loop, struct us_socket_context_t *context) {
    /* Insert this context as the head of loop */
    context->next = loop->data.head;
    context->prev = 0;
    if (loop->data.head) {
        loop->data.head->prev = context;
    }
    loop->data.head = context;
}